

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

connectdata * Curl_oldest_idle_connection(Curl_easy *data)

{
  conncache *hash;
  connectdata *pcVar1;
  curl_hash_element *pcVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  connectdata *pcVar6;
  timeval newer;
  curl_hash_iterator iter;
  curl_hash_iterator cStack_48;
  
  hash = (data->state).conn_cache;
  newer = curlx_tvnow();
  Curl_hash_start_iterate(&hash->hash,&cStack_48);
  pcVar2 = Curl_hash_next_element(&cStack_48);
  if (pcVar2 == (curl_hash_element *)0x0) {
    pcVar6 = (connectdata *)0x0;
  }
  else {
    lVar5 = -1;
    pcVar6 = (connectdata *)0x0;
    do {
      for (plVar4 = (long *)**(undefined8 **)((long)pcVar2->ptr + 0x10); plVar4 != (long *)0x0;
          plVar4 = (long *)plVar4[2]) {
        pcVar1 = (connectdata *)*plVar4;
        if ((pcVar1->inuse == false) && (lVar3 = curlx_tvdiff(newer,pcVar1->now), lVar5 < lVar3)) {
          lVar5 = lVar3;
          pcVar6 = pcVar1;
        }
      }
      pcVar2 = Curl_hash_next_element(&cStack_48);
    } while (pcVar2 != (curl_hash_element *)0x0);
  }
  return pcVar6;
}

Assistant:

struct connectdata *
Curl_oldest_idle_connection(struct Curl_easy *data)
{
  struct conncache *bc = data->state.conn_cache;
  struct curl_hash_iterator iter;
  struct curl_llist_element *curr;
  struct curl_hash_element *he;
  long highscore=-1;
  long score;
  struct timeval now;
  struct connectdata *conn_candidate = NULL;
  struct connectbundle *bundle;

  now = Curl_tvnow();

  Curl_hash_start_iterate(&bc->hash, &iter);

  he = Curl_hash_next_element(&iter);
  while(he) {
    struct connectdata *conn;

    bundle = he->ptr;

    curr = bundle->conn_list->head;
    while(curr) {
      conn = curr->ptr;

      if(!conn->inuse) {
        /* Set higher score for the age passed since the connection was used */
        score = Curl_tvdiff(now, conn->now);

        if(score > highscore) {
          highscore = score;
          conn_candidate = conn;
        }
      }
      curr = curr->next;
    }

    he = Curl_hash_next_element(&iter);
  }

  return conn_candidate;
}